

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O3

SyntaxToken * __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
::lastToken(SyntaxToken *__return_storage_ptr__,
           CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
           *this)

{
  SyntaxNode *pSVar1;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *it;
  SyntaxNode *this_00;
  
  this_00 = (SyntaxNode *)0x0;
  do {
    pSVar1 = &((this->
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).value)->super_SyntaxNode;
    this = &((this->
             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             ).next)->
            super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
    ;
    if (pSVar1 != (SyntaxNode *)0x0) {
      this_00 = pSVar1;
    }
  } while (this != (CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    *)0x0);
  if (this_00 == (SyntaxNode *)0x0) {
    SyntaxToken::invalid();
  }
  else {
    SyntaxNode::lastToken(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual SyntaxToken lastToken() const override
    {
        SyntaxNodeT node = this->lastValue();
        if (node)
            return node->lastToken();
        return SyntaxToken::invalid();
    }